

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_Plane * __thiscall
ON_SubDMeshFragment::CenterFrame(ON_Plane *__return_storage_ptr__,ON_SubDMeshFragment *this)

{
  byte bVar1;
  double *pdVar2;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  ON_Plane *pOVar6;
  ON_Plane *pOVar7;
  uint P_dex;
  byte bVar8;
  double d;
  ON_3dVector N;
  ON_3dVector local_b0;
  ON_3dVector X;
  ON_3dVector V;
  ON_3dPoint Q;
  ON_3dPoint P;
  ON_3dVector local_38;
  
  bVar8 = 0;
  bVar4 = HasValidPointAndNormalGrid(this);
  if (bVar4) {
    bVar1 = (this->m_grid).m_side_segment_count;
    if (bVar1 == 1) {
      pdVar2 = this->m_P;
      sVar3 = this->m_P_stride;
      ON_3dPoint::ON_3dPoint
                (&P,(*pdVar2 + pdVar2[sVar3] + pdVar2[sVar3 * 2] + pdVar2[sVar3 * 3]) * 0.25,
                 (pdVar2[1] + pdVar2[sVar3 + 1] + pdVar2[sVar3 * 2 + 1] + pdVar2[sVar3 * 3 + 1]) *
                 0.25,(pdVar2[2] + pdVar2[sVar3 + 2] + pdVar2[sVar3 * 2 + 2] + pdVar2[sVar3 * 3 + 2]
                      ) * 0.25);
      if (!NAN(P.x)) {
        pdVar2 = this->m_N;
        sVar3 = this->m_N_stride;
        ON_3dVector::ON_3dVector
                  ((ON_3dVector *)&Q,*pdVar2 + pdVar2[sVar3] + pdVar2[sVar3 * 2] + pdVar2[sVar3 * 3]
                   ,pdVar2[1] + pdVar2[sVar3 + 1] + pdVar2[sVar3 * 2 + 1] + pdVar2[sVar3 * 3 + 1],
                   pdVar2[2] + pdVar2[sVar3 + 2] + pdVar2[sVar3 * 2 + 2] + pdVar2[sVar3 * 3 + 2]);
        ON_3dVector::UnitVector(&N,(ON_3dVector *)&Q);
        bVar4 = ON_3dVector::IsUnitVector(&N);
        if (!bVar4) {
          ON_3dVector::ON_3dVector(&V,this->m_N);
          ON_3dVector::UnitVector((ON_3dVector *)&Q,&V);
          N.z = Q.z;
          N.x = Q.x;
          N.y = Q.y;
        }
        bVar4 = ON_3dVector::IsUnitVector(&N);
        if (bVar4) {
          ON_Plane::ON_Plane(__return_storage_ptr__,&P,&N);
          pdVar2 = this->m_P;
          sVar3 = this->m_P_stride;
          ON_3dPoint::ON_3dPoint
                    (&Q,(pdVar2[sVar3] + pdVar2[sVar3 * 3]) * 0.5,
                     (pdVar2[sVar3 + 1] + pdVar2[sVar3 * 3 + 1]) * 0.5,
                     (pdVar2[sVar3 + 2] + pdVar2[sVar3 * 3 + 2]) * 0.5);
          ON_3dPoint::operator-(&X,&Q,&P);
          ON_3dVector::UnitVector(&V,&X);
          d = ON_3dVector::operator*(&N,&V);
          ::operator*(&local_38,d,&V);
          ON_3dVector::operator-(&local_b0,&V,&local_38);
          ON_3dVector::UnitVector(&X,&local_b0);
          bVar4 = ON_3dVector::IsUnitVector(&X);
          if (!bVar4) {
            return __return_storage_ptr__;
          }
          (__return_storage_ptr__->xaxis).z = X.z;
          (__return_storage_ptr__->xaxis).x = X.x;
          (__return_storage_ptr__->xaxis).y = X.y;
          ON_CrossProduct(&local_b0,&N,&X);
          (__return_storage_ptr__->yaxis).z = local_b0.z;
          (__return_storage_ptr__->yaxis).x = local_b0.x;
          (__return_storage_ptr__->yaxis).y = local_b0.y;
          return __return_storage_ptr__;
        }
      }
    }
    else {
      P_dex = (bVar1 + 2) * (uint)bVar1 >> 1;
      ON_Plane::ON_Plane(__return_storage_ptr__);
      bVar4 = Internal_GetFrameHelper(this,P_dex,P_dex + 1,__return_storage_ptr__);
      if (bVar4) {
        return __return_storage_ptr__;
      }
      ON_Plane::~ON_Plane(__return_storage_ptr__);
    }
  }
  pOVar6 = &ON_Plane::NanPlane;
  pOVar7 = __return_storage_ptr__;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pOVar7->origin).x = (pOVar6->origin).x;
    pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDMeshFragment::CenterFrame() const
{
  if (false == HasValidPointAndNormalGrid() )
    return ON_Plane::NanPlane;

  if (1 == m_grid.m_side_segment_count)
  {
    const ON_3dPoint P(
      0.25*(m_P[0] + m_P[m_P_stride] + m_P[2 * m_P_stride] + m_P[3 * m_P_stride]),
      0.25*(m_P[1] + m_P[1 + m_P_stride] + m_P[1 + 2 * m_P_stride] + m_P[1 + 3 * m_P_stride]),
      0.25*(m_P[2] + m_P[2 + m_P_stride] + m_P[2 + 2 * m_P_stride] + m_P[2 + 3 * m_P_stride])
    );
    if( false == (P.x == P.x))
      return ON_Plane::NanPlane;
    ON_3dVector N = ON_3dVector(
      (m_N[0] + m_N[m_N_stride] + m_N[2 * m_N_stride] + m_N[3 * m_N_stride]),
      (m_N[1] + m_N[1 + m_N_stride] + m_N[1 + 2 * m_N_stride] + m_N[1 + 3 * m_N_stride]),
      (m_N[2] + m_N[2 + m_N_stride] + m_N[2 + 2 * m_N_stride] + m_N[2 + 3 * m_N_stride])
    ).UnitVector();
    if (false == N.IsUnitVector())
      N = ON_3dVector(m_N).UnitVector();
    if ( N.IsUnitVector() )
    {
      ON_Plane center_frame(P, N);
      const ON_3dPoint Q(
        0.5*(m_P[m_P_stride] + m_P[3 * m_P_stride]),
        0.5*(m_P[1 + m_P_stride] + m_P[1 + 3 * m_P_stride]),
        0.5*(m_P[2 + m_P_stride] + m_P[2 + 3 * m_P_stride])
      );
      const ON_3dVector V = (Q - P).UnitVector();
      const ON_3dVector X = (V - (N*V)*V).UnitVector();
      if (X.IsUnitVector())
      {
        center_frame.xaxis = X;
        center_frame.yaxis = ON_CrossProduct(N, X);
      }
      return center_frame;
    }
  }
  else
  {
    const unsigned int P_dex = (m_grid.m_side_segment_count*(m_grid.m_side_segment_count + 2)) / 2;
    ON_Plane center_frame;
    if (Internal_GetFrameHelper(P_dex, P_dex + 1, center_frame))
      return center_frame;
  }

  return ON_Plane::NanPlane;
}